

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O0

void garray_const(_garray *x,t_floatarg g)

{
  _array *p_Var1;
  _array *array;
  int elemsize;
  int i;
  int yonset;
  t_floatarg g_local;
  _garray *x_local;
  
  i = (int)g;
  _yonset = x;
  p_Var1 = garray_getarray_floatonly(x,&elemsize,(int *)&array);
  if (p_Var1 == (_array *)0x0) {
    pd_error((void *)0x0,"%s: needs floating-point \'y\' field",_yonset->x_realname->s_name);
  }
  else {
    for (array._4_4_ = 0; array._4_4_ < p_Var1->a_n; array._4_4_ = array._4_4_ + 1) {
      *(int *)(p_Var1->a_vec + (long)elemsize * 4 + (long)((int)array * array._4_4_)) = i;
    }
  }
  garray_redraw(_yonset);
  return;
}

Assistant:

static void garray_const(t_garray *x, t_floatarg g)
{
    int yonset, i, elemsize;
    t_array *array = garray_getarray_floatonly(x, &yonset, &elemsize);
    if (!array)
        pd_error(0, "%s: needs floating-point 'y' field", x->x_realname->s_name);
    else for (i = 0; i < array->a_n; i++)
        *((t_float *)((char *)array->a_vec
            + elemsize * i) + yonset) = g;
    garray_redraw(x);
}